

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O0

signature signature_resize(signature s,size_t count)

{
  signature in_RSI;
  void *in_RDI;
  signature_node node;
  size_t index;
  signature new_s;
  signature_node in_stack_ffffffffffffffd0;
  signature s_00;
  signature local_8;
  
  if (in_RDI == (void *)0x0) {
    local_8 = (signature)0x0;
  }
  else {
    local_8 = (signature)realloc(in_RDI,(long)in_RSI * 0x18 + 0x18);
    if (local_8 == (signature)0x0) {
      local_8 = (signature)0x0;
    }
    else {
      for (s_00 = (signature)local_8->count; s_00 < in_RSI; s_00 = (signature)((long)&s_00->ret + 1)
          ) {
        in_stack_ffffffffffffffd0 = signature_at(s_00,(size_t)in_stack_ffffffffffffffd0);
        if (in_stack_ffffffffffffffd0 != (signature_node)0x0) {
          in_stack_ffffffffffffffd0->index = 0xffffffffffffffff;
          in_stack_ffffffffffffffd0->name = (char *)0x0;
          in_stack_ffffffffffffffd0->t = (type)0x0;
        }
      }
      local_8->count = (size_t)in_RSI;
    }
  }
  return local_8;
}

Assistant:

signature signature_resize(signature s, size_t count)
{
	signature new_s;
	size_t index;

	if (s == NULL)
	{
		return NULL;
	}

	new_s = realloc(s, sizeof(struct signature_type) + sizeof(struct signature_node_type) * count);

	if (new_s == NULL)
	{
		return NULL;
	}

	for (index = new_s->count; index < count; ++index)
	{
		signature_node node = signature_at(new_s, index);

		if (node != NULL)
		{
			node->index = REFLECT_SIGNATURE_INVALID_INDEX;
			node->name = NULL;
			node->t = NULL;
		}
	}

	new_s->count = count;

	return new_s;
}